

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O2

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<0>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<0> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  int *piVar1;
  uint32_t *puVar2;
  pointer puVar3;
  pointer pvVar4;
  uint32_t uVar5;
  _Elt_pointer pDVar6;
  pointer puVar7;
  uint32_t i;
  ulong uVar8;
  uint uVar9;
  uint32_t i_1;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t j;
  ulong uVar12;
  int iVar13;
  VectorUint32 *levels;
  uint32_t uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool bVar15;
  DecodingStatus local_100;
  uint32_t number;
  ulong local_f0;
  uint32_t local_e8;
  uint32_t local_e4;
  ulong local_e0;
  _Elt_pointer local_d8;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_d0;
  ulong local_c8;
  DirectBitDecoder *local_c0;
  DirectBitDecoder *local_b8;
  VectorUint32 *local_b0;
  long local_a8;
  _Elt_pointer local_a0;
  DirectBitDecoder *local_98;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
  status_stack;
  
  init_status.num_remaining_points = 0;
  local_d0 = oit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,&init_status.num_remaining_points,(allocator_type *)&local_100)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  init_status.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,&init_status.num_remaining_points,(allocator_type *)&local_100)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  init_status.last_axis = 0;
  init_status.stack_pos = 0;
  local_e4 = num_points;
  init_status.num_remaining_points = num_points;
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>,void>
            (&status_stack);
  std::
  deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
  ::push_back(&status_stack.c,&init_status);
  local_b8 = &this->numbers_decoder_;
  local_c0 = &this->half_decoder_;
  local_b0 = &this->p_;
  local_98 = &this->remaining_bits_decoder_;
  while( true ) {
    local_a0 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_d8 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    pDVar6 = status_stack.c.
             super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pDVar6 = status_stack.c.
               super__Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
    }
    uVar14 = pDVar6[-1].num_remaining_points;
    uVar5 = pDVar6[-1].last_axis;
    local_f0 = (ulong)pDVar6[-1].stack_pos;
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
    ::pop_back(&status_stack.c);
    if (local_e4 < uVar14) break;
    local_a8 = local_f0 * 0x18;
    __x = (this->base_stack_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + local_f0;
    levels = (this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_f0;
    uVar5 = GetAxis(this,uVar14,levels,uVar5);
    uVar12 = (ulong)uVar5;
    if (this->dimension_ <= uVar5) break;
    uVar10 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    if (this->bit_length_ == uVar10) {
      while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator=(local_d0,__x);
        this->num_decoded_points_ = this->num_decoded_points_ + 1;
      }
    }
    else if (uVar14 < 3) {
      puVar2 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      *puVar2 = uVar5;
      for (uVar8 = 1; uVar8 < this->dimension_; uVar8 = uVar8 + 1) {
        uVar9 = (int)uVar12 + 1;
        if ((int)uVar12 == this->dimension_ - 1) {
          uVar9 = 0;
        }
        puVar2[uVar8] = uVar9;
        uVar12 = (ulong)uVar9;
      }
      for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
        for (uVar12 = 0; uVar12 < this->dimension_; uVar12 = uVar12 + 1) {
          puVar7 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar3 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar7[puVar3[uVar12]] = 0;
          uVar8 = (ulong)puVar3[uVar12];
          iVar13 = this->bit_length_ -
                   (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start[uVar8];
          if (iVar13 != 0) {
            bVar15 = DirectBitDecoder::DecodeLeastSignificantBits32(local_98,iVar13,puVar7 + uVar8);
            if (!bVar15) goto LAB_0014cb79;
            puVar7 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ulong)(this->axes_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12];
          }
          puVar7[uVar8] =
               puVar7[uVar8] |
               (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8];
        }
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator=(local_d0,local_b0);
        this->num_decoded_points_ = this->num_decoded_points_ + 1;
      }
    }
    else {
      if (this->num_points_ < this->num_decoded_points_) break;
      uVar8 = (ulong)((int)local_f0 + 1);
      local_e8 = this->bit_length_;
      local_e0 = uVar12;
      local_c8 = uVar8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((this->base_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,__x);
      piVar1 = (int *)(*(long *)&(this->base_stack_).
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + local_e0 * 4);
      *piVar1 = *piVar1 + (1 << ((char)local_e8 + ~(byte)uVar10 & 0x1f));
      iVar13 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar13 == 0; iVar13 = iVar13 + -1) {
        }
      }
      number = 0;
      DirectBitDecoder::DecodeLeastSignificantBits32(local_b8,iVar13,&number);
      uVar10 = (uVar14 >> 1) - number;
      if (uVar14 >> 1 < number) break;
      uVar14 = uVar14 - uVar10;
      uVar11 = uVar10;
      if ((uVar10 != uVar14) &&
         (bVar15 = DirectBitDecoder::DecodeNextBit(local_c0), uVar11 = uVar14, bVar15)) {
        uVar11 = uVar10;
        uVar10 = uVar14;
      }
      pvVar4 = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar1 = (int *)(*(long *)((long)&(pvVar4->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data + local_a8) + local_e0 * 4
                      );
      *piVar1 = *piVar1 + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (pvVar4 + uVar8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + local_a8));
      if (uVar11 != 0) {
        local_100.stack_pos = (uint32_t)local_f0;
        local_100.num_remaining_points = uVar11;
        local_100.last_axis = uVar5;
        std::
        deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>
                  (&status_stack.c,&local_100);
      }
      if (uVar10 != 0) {
        local_100.stack_pos = (uint32_t)local_c8;
        local_100.num_remaining_points = uVar10;
        local_100.last_axis = uVar5;
        std::
        deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
        ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>
                  (&status_stack.c,&local_100);
      }
    }
  }
LAB_0014cb79:
  bVar15 = local_d8 == local_a0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
  ::~_Deque_base((_Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
                  *)&status_stack);
  return bVar15;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}